

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O0

void vkt::synchronization::beginRenderPassWithRasterizationDisabled
               (DeviceInterface *vk,VkCommandBuffer commandBuffer,VkRenderPass renderPass,
               VkFramebuffer framebuffer)

{
  undefined4 local_78 [2];
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  VkCommandBuffer commandBuffer_local;
  DeviceInterface *vk_local;
  VkFramebuffer framebuffer_local;
  VkRenderPass renderPass_local;
  
  memset(&renderPassBeginInfo.pClearValues,0,0x10);
  local_78[0] = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
  renderPassBeginInfo.renderArea.extent.width = 0;
  renderPassBeginInfo.clearValueCount = 0;
  renderPassBeginInfo._52_4_ = 0;
  renderPassBeginInfo.pNext = (void *)renderPass.m_internal;
  renderPassBeginInfo.renderPass.m_internal = framebuffer.m_internal;
  (*vk->_vptr_DeviceInterface[0x74])(vk,commandBuffer,local_78,0);
  return;
}

Assistant:

void beginRenderPassWithRasterizationDisabled (const DeviceInterface&	vk,
											   const VkCommandBuffer	commandBuffer,
											   const VkRenderPass		renderPass,
											   const VkFramebuffer		framebuffer)
{
	const VkRect2D renderArea = {{ 0, 0 }, { 0, 0 }};

	const VkRenderPassBeginInfo renderPassBeginInfo = {
		VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
		DE_NULL,										// const void*             pNext;
		renderPass,										// VkRenderPass            renderPass;
		framebuffer,									// VkFramebuffer           framebuffer;
		renderArea,										// VkRect2D                renderArea;
		0u,												// uint32_t                clearValueCount;
		DE_NULL,										// const VkClearValue*     pClearValues;
	};

	vk.cmdBeginRenderPass(commandBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
}